

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

void __thiscall
cmCTestScriptHandler::AddCTestCommand
          (cmCTestScriptHandler *this,string *name,
          unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *command)

{
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> this_00;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_10;
  
  ((command->_M_t).super___uniq_ptr_impl<cmCTestCommand,_std::default_delete<cmCTestCommand>_>._M_t.
   super__Tuple_impl<0UL,_cmCTestCommand_*,_std::default_delete<cmCTestCommand>_>.
   super__Head_base<0UL,_cmCTestCommand_*,_false>._M_head_impl)->CTest =
       (this->super_cmCTestGenericHandler).CTest;
  ((command->_M_t).super___uniq_ptr_impl<cmCTestCommand,_std::default_delete<cmCTestCommand>_>._M_t.
   super__Tuple_impl<0UL,_cmCTestCommand_*,_std::default_delete<cmCTestCommand>_>.
   super__Head_base<0UL,_cmCTestCommand_*,_false>._M_head_impl)->CTestScriptHandler = this;
  this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
  super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
  super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
       (((this->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
         super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
         super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
  local_10._M_head_impl =
       (command->_M_t).super___uniq_ptr_impl<cmCTestCommand,_std::default_delete<cmCTestCommand>_>.
       _M_t.super__Tuple_impl<0UL,_cmCTestCommand_*,_std::default_delete<cmCTestCommand>_>.
       super__Head_base<0UL,_cmCTestCommand_*,_false>._M_head_impl;
  (command->_M_t).super___uniq_ptr_impl<cmCTestCommand,_std::default_delete<cmCTestCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCTestCommand_*,_std::default_delete<cmCTestCommand>_>.
  super__Head_base<0UL,_cmCTestCommand_*,_false>._M_head_impl = (cmCTestCommand *)0x0;
  cmState::AddBuiltinCommand
            ((cmState *)
             this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name,
             (unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)&local_10);
  if (local_10._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_10._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  return;
}

Assistant:

void cmCTestScriptHandler::AddCTestCommand(
  std::string const& name, std::unique_ptr<cmCTestCommand> command)
{
  command->CTest = this->CTest;
  command->CTestScriptHandler = this;
  this->CMake->GetState()->AddBuiltinCommand(name, std::move(command));
}